

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint8_linear_scaled(float *decodep,int width_times_channels,void *inputp)

{
  uint6 uVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float *pfVar22;
  bool bVar23;
  __m128i zero;
  __m128 of3;
  __m128 of2;
  __m128 of1;
  __m128 of0;
  __m128i o3;
  __m128i o2;
  __m128i o1;
  __m128i o0;
  __m128i i;
  uchar *end_input_m16;
  uchar *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  byte local_f8;
  byte bStack_f7;
  byte bStack_f6;
  byte bStack_f5;
  byte bStack_f4;
  undefined1 uStack_f3;
  byte bStack_f2;
  byte bStack_f1;
  byte bStack_d0;
  byte bStack_cf;
  byte bStack_ce;
  byte bStack_cd;
  byte bStack_cc;
  byte bStack_cb;
  byte bStack_ca;
  byte bStack_c9;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint uStack_b4;
  uint uStack_ac;
  int local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint uStack_94;
  uint uStack_8c;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  pfVar22 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    end_input_m16 = (uchar *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar22; decode_end = decode_end + 4) {
      decode_end[-4] = (float)*end_input_m16 * 0.003921569;
      decode_end[-3] = (float)end_input_m16[1] * 0.003921569;
      decode_end[-2] = (float)end_input_m16[2] * 0.003921569;
      decode_end[-1] = (float)end_input_m16[3] * 0.003921569;
      end_input_m16 = end_input_m16 + 4;
    }
    for (decode_end = decode_end + -4; decode_end < pfVar22; decode_end = decode_end + 1) {
      *decode_end = (float)*end_input_m16 * 0.003921569;
      end_input_m16 = end_input_m16 + 1;
    }
  }
  else {
    end_input_m16 = (uchar *)inputp;
    decode_end = decodep;
    do {
      do {
        uVar3 = *(undefined8 *)end_input_m16;
        uVar6 = *(undefined8 *)(end_input_m16 + 8);
        local_f8 = (byte)uVar3;
        bStack_f7 = (byte)((ulong)uVar3 >> 8);
        bStack_f6 = (byte)((ulong)uVar3 >> 0x10);
        bStack_f5 = (byte)((ulong)uVar3 >> 0x18);
        bStack_f4 = (byte)((ulong)uVar3 >> 0x20);
        uStack_f3 = (undefined1)((ulong)uVar3 >> 0x28);
        bStack_f2 = (byte)((ulong)uVar3 >> 0x30);
        bStack_f1 = (byte)((ulong)uVar3 >> 0x38);
        bStack_d0 = (byte)uVar6;
        bStack_cf = (byte)((ulong)uVar6 >> 8);
        bStack_ce = (byte)((ulong)uVar6 >> 0x10);
        bStack_cd = (byte)((ulong)uVar6 >> 0x18);
        bStack_cc = (byte)((ulong)uVar6 >> 0x20);
        bStack_cb = (byte)((ulong)uVar6 >> 0x28);
        bStack_ca = (byte)((ulong)uVar6 >> 0x30);
        bStack_c9 = (byte)((ulong)uVar6 >> 0x38);
        uVar1 = (uint6)CONCAT14(uStack_f3,(uint)CONCAT12(uStack_f3,(ushort)bStack_f4)) &
                0xffff0000ffff;
        uStack_94 = (uint)bStack_f7;
        uStack_8c = (uint)bStack_f5;
        fVar15 = (float)uStack_94;
        fVar16 = (float)bStack_f6;
        fVar17 = (float)uStack_8c;
        uVar3 = CONCAT17((char)((uint)fVar15 >> 0x18),
                         CONCAT16((char)((uint)fVar15 >> 0x10),
                                  CONCAT15((char)((uint)fVar15 >> 8),
                                           CONCAT14(SUB41(fVar15,0),(float)local_f8))));
        auVar4[8] = SUB41(fVar16,0);
        auVar4._0_8_ = uVar3;
        auVar4[9] = (char)((uint)fVar16 >> 8);
        auVar4[10] = (char)((uint)fVar16 >> 0x10);
        auVar4[0xb] = (char)((uint)fVar16 >> 0x18);
        auVar2[0xc] = SUB41(fVar17,0);
        auVar2._0_12_ = auVar4;
        auVar2[0xd] = (char)((uint)fVar17 >> 8);
        auVar2[0xe] = (char)((uint)fVar17 >> 0x10);
        auVar2[0xf] = (char)((uint)fVar17 >> 0x18);
        local_a8 = (int)uVar1;
        uStack_a4 = (uint)(ushort)(uVar1 >> 0x20);
        uStack_a0 = (uint)bStack_f2;
        uStack_9c = (uint)bStack_f1;
        fVar15 = (float)uStack_a4;
        fVar16 = (float)uStack_a0;
        fVar17 = (float)uStack_9c;
        uVar6 = CONCAT17((char)((uint)fVar15 >> 0x18),
                         CONCAT16((char)((uint)fVar15 >> 0x10),
                                  CONCAT15((char)((uint)fVar15 >> 8),
                                           CONCAT14(SUB41(fVar15,0),(float)local_a8))));
        auVar7[8] = SUB41(fVar16,0);
        auVar7._0_8_ = uVar6;
        auVar7[9] = (char)((uint)fVar16 >> 8);
        auVar7[10] = (char)((uint)fVar16 >> 0x10);
        auVar7[0xb] = (char)((uint)fVar16 >> 0x18);
        auVar5[0xc] = SUB41(fVar17,0);
        auVar5._0_12_ = auVar7;
        auVar5[0xd] = (char)((uint)fVar17 >> 8);
        auVar5[0xe] = (char)((uint)fVar17 >> 0x10);
        auVar5[0xf] = (char)((uint)fVar17 >> 0x18);
        uStack_b4 = (uint)bStack_cf;
        uStack_ac = (uint)bStack_cd;
        fVar15 = (float)uStack_b4;
        fVar16 = (float)bStack_ce;
        fVar17 = (float)uStack_ac;
        uVar9 = CONCAT17((char)((uint)fVar15 >> 0x18),
                         CONCAT16((char)((uint)fVar15 >> 0x10),
                                  CONCAT15((char)((uint)fVar15 >> 8),
                                           CONCAT14(SUB41(fVar15,0),(float)bStack_d0))));
        auVar10[8] = SUB41(fVar16,0);
        auVar10._0_8_ = uVar9;
        auVar10[9] = (char)((uint)fVar16 >> 8);
        auVar10[10] = (char)((uint)fVar16 >> 0x10);
        auVar10[0xb] = (char)((uint)fVar16 >> 0x18);
        auVar8[0xc] = SUB41(fVar17,0);
        auVar8._0_12_ = auVar10;
        auVar8[0xd] = (char)((uint)fVar17 >> 8);
        auVar8[0xe] = (char)((uint)fVar17 >> 0x10);
        auVar8[0xf] = (char)((uint)fVar17 >> 0x18);
        uStack_c4 = (uint)bStack_cb;
        uStack_c0 = (uint)bStack_ca;
        uStack_bc = (uint)bStack_c9;
        fVar15 = (float)uStack_c4;
        fVar16 = (float)uStack_c0;
        fVar17 = (float)uStack_bc;
        uVar12 = CONCAT17((char)((uint)fVar15 >> 0x18),
                          CONCAT16((char)((uint)fVar15 >> 0x10),
                                   CONCAT15((char)((uint)fVar15 >> 8),
                                            CONCAT14(SUB41(fVar15,0),(float)bStack_cc))));
        auVar13[8] = SUB41(fVar16,0);
        auVar13._0_8_ = uVar12;
        auVar13[9] = (char)((uint)fVar16 >> 8);
        auVar13[10] = (char)((uint)fVar16 >> 0x10);
        auVar13[0xb] = (char)((uint)fVar16 >> 0x18);
        auVar11[0xc] = SUB41(fVar17,0);
        auVar11._0_12_ = auVar13;
        auVar11[0xd] = (char)((uint)fVar17 >> 8);
        auVar11[0xe] = (char)((uint)fVar17 >> 0x10);
        auVar11[0xf] = (char)((uint)fVar17 >> 0x18);
        fStack_14 = (float)((ulong)uVar3 >> 0x20);
        fStack_10 = auVar4._8_4_;
        fStack_c = auVar2._12_4_;
        fStack_14 = fStack_14 * 0.003921569;
        fStack_10 = fStack_10 * 0.003921569;
        fStack_c = fStack_c * 0.003921569;
        uVar19 = CONCAT17((char)((uint)fStack_14 >> 0x18),
                          CONCAT16((char)((uint)fStack_14 >> 0x10),
                                   CONCAT15((char)((uint)fStack_14 >> 8),
                                            CONCAT14(SUB41(fStack_14,0),
                                                     (float)local_f8 * 0.003921569))));
        auVar18[8] = SUB41(fStack_10,0);
        auVar18._0_8_ = uVar19;
        auVar18[9] = (char)((uint)fStack_10 >> 8);
        auVar18[10] = (char)((uint)fStack_10 >> 0x10);
        auVar18[0xb] = (char)((uint)fStack_10 >> 0x18);
        auVar18[0xc] = SUB41(fStack_c,0);
        auVar18[0xd] = (char)((uint)fStack_c >> 8);
        auVar18[0xe] = (char)((uint)fStack_c >> 0x10);
        auVar18[0xf] = (char)((uint)fStack_c >> 0x18);
        fStack_34 = (float)((ulong)uVar6 >> 0x20);
        fStack_30 = auVar7._8_4_;
        fStack_2c = auVar5._12_4_;
        fStack_34 = fStack_34 * 0.003921569;
        fStack_30 = fStack_30 * 0.003921569;
        fStack_2c = fStack_2c * 0.003921569;
        uVar6 = CONCAT17((char)((uint)fStack_34 >> 0x18),
                         CONCAT16((char)((uint)fStack_34 >> 0x10),
                                  CONCAT15((char)((uint)fStack_34 >> 8),
                                           CONCAT14(SUB41(fStack_34,0),(float)local_a8 * 0.003921569
                                                   ))));
        auVar20[8] = SUB41(fStack_30,0);
        auVar20._0_8_ = uVar6;
        auVar20[9] = (char)((uint)fStack_30 >> 8);
        auVar20[10] = (char)((uint)fStack_30 >> 0x10);
        auVar20[0xb] = (char)((uint)fStack_30 >> 0x18);
        auVar20[0xc] = SUB41(fStack_2c,0);
        auVar20[0xd] = (char)((uint)fStack_2c >> 8);
        auVar20[0xe] = (char)((uint)fStack_2c >> 0x10);
        auVar20[0xf] = (char)((uint)fStack_2c >> 0x18);
        fStack_54 = (float)((ulong)uVar9 >> 0x20);
        fStack_50 = auVar10._8_4_;
        fStack_4c = auVar8._12_4_;
        fStack_54 = fStack_54 * 0.003921569;
        fStack_50 = fStack_50 * 0.003921569;
        fStack_4c = fStack_4c * 0.003921569;
        uVar9 = CONCAT17((char)((uint)fStack_54 >> 0x18),
                         CONCAT16((char)((uint)fStack_54 >> 0x10),
                                  CONCAT15((char)((uint)fStack_54 >> 8),
                                           CONCAT14(SUB41(fStack_54,0),
                                                    (float)bStack_d0 * 0.003921569))));
        auVar21[8] = SUB41(fStack_50,0);
        auVar21._0_8_ = uVar9;
        auVar21[9] = (char)((uint)fStack_50 >> 8);
        auVar21[10] = (char)((uint)fStack_50 >> 0x10);
        auVar21[0xb] = (char)((uint)fStack_50 >> 0x18);
        auVar21[0xc] = SUB41(fStack_4c,0);
        auVar21[0xd] = (char)((uint)fStack_4c >> 8);
        auVar21[0xe] = (char)((uint)fStack_4c >> 0x10);
        auVar21[0xf] = (char)((uint)fStack_4c >> 0x18);
        fStack_74 = (float)((ulong)uVar12 >> 0x20);
        fStack_70 = auVar13._8_4_;
        fStack_6c = auVar11._12_4_;
        fStack_74 = fStack_74 * 0.003921569;
        fStack_70 = fStack_70 * 0.003921569;
        fStack_6c = fStack_6c * 0.003921569;
        uVar3 = CONCAT17((char)((uint)fStack_74 >> 0x18),
                         CONCAT16((char)((uint)fStack_74 >> 0x10),
                                  CONCAT15((char)((uint)fStack_74 >> 8),
                                           CONCAT14(SUB41(fStack_74,0),
                                                    (float)bStack_cc * 0.003921569))));
        auVar14[8] = SUB41(fStack_70,0);
        auVar14._0_8_ = uVar3;
        auVar14[9] = (char)((uint)fStack_70 >> 8);
        auVar14[10] = (char)((uint)fStack_70 >> 0x10);
        auVar14[0xb] = (char)((uint)fStack_70 >> 0x18);
        auVar14[0xc] = SUB41(fStack_6c,0);
        auVar14[0xd] = (char)((uint)fStack_6c >> 8);
        auVar14[0xe] = (char)((uint)fStack_6c >> 0x10);
        auVar14[0xf] = (char)((uint)fStack_6c >> 0x18);
        of0._0_8_ = auVar18._8_8_;
        *(undefined8 *)decode_end = uVar19;
        *(undefined8 *)(decode_end + 2) = of0._0_8_;
        of1._0_8_ = auVar20._8_8_;
        *(undefined8 *)(decode_end + 4) = uVar6;
        *(undefined8 *)(decode_end + 6) = of1._0_8_;
        of2._0_8_ = auVar21._8_8_;
        *(undefined8 *)(decode_end + 8) = uVar9;
        *(undefined8 *)(decode_end + 10) = of2._0_8_;
        of3._0_8_ = auVar14._8_8_;
        *(undefined8 *)(decode_end + 0xc) = uVar3;
        *(undefined8 *)(decode_end + 0xe) = of3._0_8_;
        decode_end = decode_end + 0x10;
        end_input_m16 = end_input_m16 + 0x10;
      } while (decode_end <= pfVar22 + -0x10);
      bVar23 = decode_end != pfVar22;
      end_input_m16 = (uchar *)((long)inputp + (long)width_times_channels + -0x10);
      decode_end = pfVar22 + -0x10;
    } while (bVar23);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__decode_uint8_linear_scaled )( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const*)inputp;

  #ifdef STBIR_SIMD
  unsigned char const * end_input_m16 = input + width_times_channels - 16;
  if ( width_times_channels >= 16 )
  {
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o0,o1;
      stbir__simdf8 of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u8_to_u32( o0, o1, i );
      stbir__simdi8_convert_i32_to_float( of0, o0 );
      stbir__simdi8_convert_i32_to_float( of1, o1 );
      stbir__simdf8_mult( of0, of0, STBIR_max_uint8_as_float_inverted8);
      stbir__simdf8_mult( of1, of1, STBIR_max_uint8_as_float_inverted8);
      stbir__decode_simdf8_flip( of0 );
      stbir__decode_simdf8_flip( of1 );
      stbir__simdf8_store( decode + 0, of0 );
      stbir__simdf8_store( decode + 8, of1 );
      #else
      stbir__simdi i, o0, o1, o2, o3;
      stbir__simdf of0, of1, of2, of3;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u8_to_u32( o0,o1,o2,o3,i);
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdi_convert_i32_to_float( of2, o2 );
      stbir__simdi_convert_i32_to_float( of3, o3 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of2, of2, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of3, of3, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__decode_simdf4_flip( of2 );
      stbir__decode_simdf4_flip( of3 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      stbir__simdf_store( decode + 8,  of2 );
      stbir__simdf_store( decode + 12, of3 );
      #endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint8_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}